

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::NegativeVertexAttribBinding::Run(NegativeVertexAttribBinding *this)

{
  GLenum GVar1;
  undefined8 in_RAX;
  CallLogWrapper *this_00;
  char *format;
  GLint p;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8869,&local_14);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,local_14 + 1,0);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glGetIntegerv(this_00,0x82da,&local_14);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,0,local_14 + 1);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0);
      GVar1 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar1 == 0x502) {
        return 0;
      }
      format = "INVALID_OPERATION should be generated (default VAO).\n";
    }
    else {
      format = 
      "INVALID_VALUE should be generated (bindingIndex greater than GL_MAX_VERTEX_ATTRIB_BINDINGS).\n"
      ;
    }
  }
  else {
    format = "INVALID_VALUE should be generated (attribindex greater than GL_MAX_VERTEX_ATTRIBS).\n"
    ;
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		/*
		 Errors
		 An INVALID_VALUE error is generated if attribindex is greater than or
		 equal to the value of MAX_VERTEX_ATTRIBS.
		 An INVALID_VALUE error is generated if bindingindex is greater than or
		 equal to the value of MAX_VERTEX_ATTRIB_BINDINGS.
		 An INVALID_OPERATION error is generated if no vertex array object is
		 bound.
		 */
		glBindVertexArray(m_vao);
		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &p);
		glVertexAttribBinding(p + 1, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated (attribindex greater than GL_MAX_VERTEX_ATTRIBS).\n");
			return ERROR;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		glVertexAttribBinding(0, p + 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated (bindingIndex greater than GL_MAX_VERTEX_ATTRIB_BINDINGS).\n");
			return ERROR;
		}
		glBindVertexArray(0);
		glVertexAttribBinding(0, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated (default VAO).\n");
			return ERROR;
		}
		return NO_ERROR;
	}